

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.h
# Opt level: O1

void __thiscall IfStatement::execute(IfStatement *this,Environment *env)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  Environment local;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  peVar1 = (this->condition).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar1->_vptr_Expression)(&local_58,peVar1,env);
  bVar3 = (*(code *)(*local_58._M_buckets)[5]._M_nxt)();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_bucket_count !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_bucket_count);
  }
  Environment::Environment((Environment *)&local_58,env);
  peVar2 = (&this->trueBlock)[bVar3 ^ 1].
           super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar2->super_Statement)._vptr_Statement)(peVar2,&local_58);
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_58);
  return;
}

Assistant:

void execute(Environment *env) override {
        bool conditionTrue = condition -> evaluate(env) -> asBoolean();
        Environment local = *env;

        if(conditionTrue) {
            trueBlock -> execute(&local);
        } else {
            falseBlock -> execute(&local);
        }
    }